

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_1::SingletonEnv<leveldb::(anonymous_namespace)::PosixEnv>::SingletonEnv
          (SingletonEnv<leveldb::(anonymous_namespace)::PosixEnv> *this)

{
  long in_FS_OFFSET;
  atomic<bool> *unaff_retaddr;
  PosixEnv *in_stack_00000048;
  long lVar1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::atomic<bool>::store(unaff_retaddr,SUB81((ulong)lVar1 >> 0x38,0),(memory_order)lVar1);
  PosixEnv::PosixEnv(in_stack_00000048);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SingletonEnv() {
#if !defined(NDEBUG)
    env_initialized_.store(true, std::memory_order_relaxed);
#endif  // !defined(NDEBUG)
    static_assert(sizeof(env_storage_) >= sizeof(EnvType),
                  "env_storage_ will not fit the Env");
    static_assert(alignof(decltype(env_storage_)) >= alignof(EnvType),
                  "env_storage_ does not meet the Env's alignment needs");
    new (&env_storage_) EnvType();
  }